

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O3

void __thiscall kratos::FSM::output(FSM *this,shared_ptr<kratos::Var> *var)

{
  shared_ptr<kratos::Var> local_18;
  
  local_18.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_18.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  output(this,var,&local_18);
  return;
}

Assistant:

void FSM::output(const std::shared_ptr<Var>& var) { output(var, nullptr); }